

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::AddEnum
          (ExtensionSet *this,int number,FieldType type,bool packed,int value,
          FieldDescriptor *descriptor)

{
  byte bVar1;
  _Rb_tree_color _Var2;
  Arena *this_00;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  _Var3;
  LogMessage *pLVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_bool>
  pVar7;
  LogFinisher local_111;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  local_110.filename_ = (char *)0x0;
  local_110.line_ = 0;
  local_110._20_4_ = 0;
  local_110.message_._M_dataplus._M_p = (pointer)0x0;
  local_110.level_ = number;
  pVar7 = std::
          _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
          ::_M_emplace_unique<std::pair<int,google::protobuf::internal::ExtensionSet::Extension>>
                    ((_Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                      *)this,(pair<int,_google::protobuf::internal::ExtensionSet::Extension> *)
                             &local_110);
  _Var3 = pVar7.first._M_node;
  _Var3._M_node[1]._M_right = (_Base_ptr)descriptor;
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (*(char *)((long)&_Var3._M_node[1]._M_left + 1) == '\0') {
      LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1da);
      pLVar4 = LogMessage::operator<<
                         (&local_d8,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (REPEATED): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_110,pLVar4);
      LogMessage::~LogMessage(&local_d8);
    }
    bVar1 = *(byte *)&_Var3._M_node[1]._M_left;
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x34);
      pLVar4 = LogMessage::operator<<
                         (&local_110,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_a0,pLVar4);
      LogMessage::~LogMessage(&local_110);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 8) {
      LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1da);
      pLVar4 = LogMessage::operator<<
                         (&local_a0,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_68,pLVar4);
      LogMessage::~LogMessage(&local_a0);
    }
    if ((bool)*(char *)((long)&_Var3._M_node[1]._M_left + 3) != packed) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1db);
      pLVar4 = LogMessage::operator<<
                         (&local_68,"CHECK failed: (extension->is_packed) == (packed): ");
      LogFinisher::operator=(&local_111,pLVar4);
      LogMessage::~LogMessage(&local_68);
    }
  }
  else {
    *(FieldType *)&_Var3._M_node[1]._M_left = type;
    if ((byte)(type - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x34);
      pLVar4 = LogMessage::operator<<
                         (&local_110,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_d8,pLVar4);
      LogMessage::~LogMessage(&local_110);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) != 8) {
      LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1d4);
      pLVar4 = LogMessage::operator<<
                         (&local_d8,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_a0,pLVar4);
      LogMessage::~LogMessage(&local_d8);
    }
    *(undefined1 *)((long)&_Var3._M_node[1]._M_left + 1) = 1;
    *(bool *)((long)&_Var3._M_node[1]._M_left + 3) = packed;
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) {
      p_Var5 = (_Base_ptr)operator_new(0x10);
      *(undefined8 *)p_Var5 = 0;
      p_Var5->_M_parent = (_Base_ptr)0x0;
    }
    else {
      p_Var5 = (_Base_ptr)
               Arena::AllocateAligned(this_00,(type_info *)&RepeatedField<int>::typeinfo,0x10);
      *(undefined8 *)p_Var5 = 0;
      p_Var5->_M_parent = (_Base_ptr)0x0;
      p_Var6 = (_Base_ptr)Arena::AllocateAligned(this_00,(type_info *)&char::typeinfo,8);
      p_Var5->_M_parent = p_Var6;
      *(Arena **)p_Var6 = this_00;
      Arena::AddListNode(this_00,p_Var5,arena_destruct_object<google::protobuf::RepeatedField<int>>)
      ;
    }
    _Var3._M_node[1]._M_parent = p_Var5;
  }
  p_Var5 = _Var3._M_node[1]._M_parent;
  if (p_Var5->_M_color == *(_Rb_tree_color *)&p_Var5->field_0x4) {
    RepeatedField<int>::Reserve
              ((RepeatedField<int> *)p_Var5,*(_Rb_tree_color *)&p_Var5->field_0x4 + _S_black);
  }
  _Var2 = p_Var5->_M_color;
  p_Var5->_M_color = _Var2 + _S_black;
  *(int *)((long)&p_Var5->_M_parent->_M_parent + (long)(int)_Var2 * 4) = value;
  return;
}

Assistant:

void ExtensionSet::AddEnum(int number, FieldType type,
                           bool packed, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = true;
    extension->is_packed = packed;
    extension->repeated_enum_value =
        Arena::CreateMessage<RepeatedField<int> >(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED, ENUM);
    GOOGLE_DCHECK_EQ(extension->is_packed, packed);
  }
  extension->repeated_enum_value->Add(value);
}